

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesOptionsWidget.cxx
# Opt level: O2

bool __thiscall
cmCursesOptionsWidget::HandleInput
          (cmCursesOptionsWidget *this,int *key,cmCursesMainForm *param_2,WINDOW *w)

{
  int iVar1;
  ulong uVar2;
  
  iVar1 = *key;
  if (iVar1 == 2) {
LAB_002658e5:
    if (w == (WINDOW *)0x0) {
      uVar2 = 0xffffffffffffffff;
    }
    else {
      uVar2 = (ulong)((int)w->_maxy + 1);
    }
    wtouchln(w,0,uVar2,1);
    wrefresh(w);
    PreviousOption(this);
  }
  else {
    if ((iVar1 != 6) && (iVar1 != 0x157)) {
      if (iVar1 == 0x104) goto LAB_002658e5;
      if ((iVar1 != 0x105) && (iVar1 != 10)) {
        return false;
      }
    }
    NextOption(this);
    if (w == (WINDOW *)0x0) {
      uVar2 = 0xffffffffffffffff;
    }
    else {
      uVar2 = (ulong)((int)w->_maxy + 1);
    }
    wtouchln(w,0,uVar2,1);
    wrefresh(w);
  }
  return true;
}

Assistant:

bool cmCursesOptionsWidget::HandleInput(int& key, cmCursesMainForm*, WINDOW* w)
{

  // 10 == enter
  if (key == 10 || key == KEY_ENTER)
    {
    this->NextOption();
    touchwin(w);
    wrefresh(w);
    return true;
    }
  else if (key == KEY_LEFT || key == ctrl('b'))
    {
    touchwin(w);
    wrefresh(w);
    this->PreviousOption();
    return true;
    }
  else if (key == KEY_RIGHT || key == ctrl('f'))
    {
    this->NextOption();
    touchwin(w);
    wrefresh(w);
    return true;
    }
  else
    {
    return false;
    }
}